

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_get_col_minmax(fitsfile *fptr,int colnum,double *datamin,double *datamax,int *status)

{
  double dVar1;
  long lVar2;
  long nelem;
  long firstrow;
  double dVar3;
  double nulval;
  long nrows;
  fitsfile *local_1f88;
  int anynul;
  double array [1000];
  
  local_1f88 = fptr;
  ffgky(fptr,0x29,"NAXIS2",&nrows,(char *)0x0,status);
  nulval = -9.1191291391491e-36;
  *datamin = 9e+36;
  *datamax = -9e+36;
  if (nrows != 0) {
    firstrow = 1;
    do {
      lVar2 = nrows;
      nelem = 100;
      if (nrows < 100) {
        nelem = nrows;
      }
      ffgcv(local_1f88,0x52,colnum,firstrow,1,nelem,&nulval,array,&anynul,status);
      if (0 < lVar2) {
        lVar2 = 0;
        do {
          dVar1 = array[lVar2];
          if ((dVar1 != nulval) || (NAN(dVar1) || NAN(nulval))) {
            dVar3 = *datamin;
            if (dVar1 <= *datamin) {
              dVar3 = dVar1;
            }
            *datamin = dVar3;
            dVar3 = *datamax;
            if (*datamax <= dVar1) {
              dVar3 = dVar1;
            }
            *datamax = dVar3;
          }
          lVar2 = lVar2 + 1;
        } while (nelem != lVar2);
      }
      firstrow = firstrow + nelem;
      nrows = nrows - nelem;
    } while (nrows != 0);
  }
  return *status;
}

Assistant:

int fits_get_col_minmax(fitsfile *fptr, int colnum, double *datamin, 
			double *datamax, int *status)
/* 
   Simple utility routine to compute the min and max value in a column
*/
{
    int anynul;
    long nrows, ntodo, firstrow, ii;
    double array[1000], nulval;

    ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

    firstrow = 1;
    nulval = DOUBLENULLVALUE;
    *datamin =  9.0E36;
    *datamax = -9.0E36;

    while(nrows)
    {
        ntodo = minvalue(nrows, 100);
        ffgcv(fptr, TDOUBLE, colnum, firstrow, 1, ntodo, &nulval, array,
              &anynul, status);

        for (ii = 0; ii < ntodo; ii++)
        {
            if (array[ii] != nulval)
            {
                *datamin = minvalue(*datamin, array[ii]);
                *datamax = maxvalue(*datamax, array[ii]);
            }
        }

        nrows -= ntodo;
        firstrow += ntodo;
    }
    return(*status);
}